

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateMessageFile
               (FileDescriptor *file,Descriptor *message,bool is_descriptor,
               GeneratorContext *generator_context)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Printer *printer_00;
  OneofDescriptor *this;
  Descriptor *pDVar8;
  long *in_RCX;
  byte in_DL;
  Descriptor *in_RSI;
  Printer *in_RDI;
  int i_5;
  int i_4;
  OneofDescriptor *oneof_1;
  int i_3;
  FieldDescriptor *field_1;
  int i_2;
  string metadata_fullname;
  string metadata_filename;
  OneofDescriptor *oneof;
  int i_1;
  FieldDescriptor *field;
  int i;
  int lastindex;
  string fullname;
  Printer printer;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  string filename;
  undefined1 in_stack_000002cf;
  FieldDescriptor *in_stack_000002d0;
  Printer *in_stack_fffffffffffffd38;
  Printer *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  Printer *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd64;
  string *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd88;
  int iVar9;
  undefined4 in_stack_fffffffffffffd8c;
  Printer *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  int iVar10;
  undefined4 in_stack_fffffffffffffd9c;
  Printer *in_stack_fffffffffffffda0;
  Printer *in_stack_fffffffffffffdb0;
  undefined1 *puVar11;
  undefined1 is_descriptor_00;
  Descriptor *message_00;
  int local_228;
  int local_224;
  string local_220 [32];
  string local_200 [4];
  int in_stack_fffffffffffffe04;
  Descriptor *in_stack_fffffffffffffe08;
  Printer *in_stack_fffffffffffffe10;
  int local_1d4;
  int local_1c4;
  string local_1c0 [32];
  string local_1a0 [32];
  Printer *local_180;
  int local_174;
  Printer *local_170;
  int local_164;
  string local_160 [32];
  string local_140 [8];
  GeneratorContext *in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffed7;
  Descriptor *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  string local_118 [208];
  GeneratorContext *in_stack_ffffffffffffffb8;
  Descriptor local_40 [7];
  undefined1 in_stack_ffffffffffffffc7;
  EnumDescriptor *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  FileDescriptor *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  Descriptor::options(in_RSI);
  bVar2 = MessageOptions::map_entry((MessageOptions *)0x4a99ef);
  if (!bVar2) {
    message_00 = local_40;
    GeneratedClassFileName<google::protobuf::Descriptor>
              ((Descriptor *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               SUB81((ulong)in_stack_fffffffffffffd90 >> 0x38,0));
    printer_00 = (Printer *)(**(code **)(*in_RCX + 0x10))(in_RCX,message_00);
    puVar11 = &stack0xffffffffffffffb8;
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
    ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
              ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                *)in_stack_fffffffffffffd40,(pointer)in_stack_fffffffffffffd38);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
           *)in_stack_fffffffffffffd40);
    io::Printer::Printer
              (in_stack_fffffffffffffd50,
               (ZeroCopyOutputStream *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
               ,(char)((ulong)in_stack_fffffffffffffd40 >> 0x38));
    GenerateHead((FileDescriptor *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    FilenameToClassname(in_stack_fffffffffffffd78);
    iVar3 = std::__cxx11::string::find_last_of((char *)local_118,0x7627d6);
    if (iVar3 != -1) {
      std::__cxx11::string::substr((ulong)local_140,(ulong)local_118);
      io::Printer::Print<char[5],std::__cxx11::string>
                (in_stack_fffffffffffffda0,
                 (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 &in_stack_fffffffffffffd90->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      std::__cxx11::string::~string(local_140);
    }
    GenerateUseDeclaration
              (SUB81((ulong)in_stack_fffffffffffffd40 >> 0x38,0),in_stack_fffffffffffffd38);
    GenerateMessageDocComment(printer_00,message_00,(int)((ulong)puVar11 >> 0x20));
    if (iVar3 != -1) {
      std::__cxx11::string::substr((ulong)local_160,(ulong)local_118);
      std::__cxx11::string::operator=(local_118,local_160);
      std::__cxx11::string::~string(local_160);
    }
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_fffffffffffffda0,
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               &in_stack_fffffffffffffd90->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    Indent((Printer *)0x4a9c94);
    for (local_164 = 0; iVar7 = local_164, iVar4 = Descriptor::field_count(in_RSI), iVar7 < iVar4;
        local_164 = local_164 + 1) {
      in_stack_fffffffffffffdb0 = (Printer *)Descriptor::field(in_RSI,local_164);
      local_170 = in_stack_fffffffffffffdb0;
      GenerateField((FieldDescriptor *)in_stack_fffffffffffffda0,
                    (Printer *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                    SUB81((ulong)in_stack_fffffffffffffd90 >> 0x38,0));
    }
    local_174 = 0;
    while (iVar7 = local_174, iVar4 = Descriptor::oneof_decl_count(in_RSI), iVar7 < iVar4) {
      in_stack_fffffffffffffda0 = (Printer *)Descriptor::oneof_decl(in_RSI,local_174);
      local_180 = in_stack_fffffffffffffda0;
      GenerateOneofField((OneofDescriptor *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      local_174 = local_174 + 1;
    }
    io::Printer::Print<>
              (in_stack_fffffffffffffd90,
               (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    GenerateMessageConstructorDocComment
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
    io::Printer::Print<>
              (in_stack_fffffffffffffd90,
               (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    Indent((Printer *)0x4a9e1d);
    GeneratedMetadataFileName_abi_cxx11_(in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
    FilenameToClassname(in_stack_fffffffffffffd78);
    io::Printer::Print<char[9],std::__cxx11::string>
              (in_stack_fffffffffffffda0,
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               &in_stack_fffffffffffffd90->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    Outdent((Printer *)0x4a9e8a);
    io::Printer::Print<>
              (in_stack_fffffffffffffd90,
               (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    local_1c4 = 0;
    while (iVar10 = local_1c4, iVar5 = Descriptor::field_count(in_RSI), iVar10 < iVar5) {
      in_stack_fffffffffffffd90 = (Printer *)Descriptor::field(in_RSI,local_1c4);
      GenerateFieldAccessor(in_stack_000002d0,(bool)in_stack_000002cf,(Printer *)file);
      local_1c4 = local_1c4 + 1;
    }
    local_1d4 = 0;
    while( true ) {
      iVar9 = local_1d4;
      iVar6 = Descriptor::oneof_decl_count(in_RSI);
      is_descriptor_00 = (undefined1)((ulong)puVar11 >> 0x38);
      if (iVar6 <= iVar9) break;
      this = Descriptor::oneof_decl(in_RSI,local_1d4);
      OneofDescriptor::name_abi_cxx11_(this);
      UnderscoresToCamelCase
                (in_stack_fffffffffffffd68,SUB41((uint)in_stack_fffffffffffffd64 >> 0x18,0));
      OneofDescriptor::name_abi_cxx11_(this);
      io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
                (in_stack_fffffffffffffdb0,(char *)CONCAT44(iVar4,iVar7),
                 &in_stack_fffffffffffffda0->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar5,iVar10),&in_stack_fffffffffffffd90->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar6,iVar9));
      std::__cxx11::string::~string(local_200);
      local_1d4 = local_1d4 + 1;
    }
    Outdent((Printer *)0x4aa098);
    io::Printer::Print<>(in_stack_fffffffffffffd90,(char *)CONCAT44(iVar6,iVar9));
    pDVar8 = Descriptor::containing_type(in_RSI);
    if (pDVar8 != (Descriptor *)0x0) {
      io::Printer::Print<>(in_stack_fffffffffffffd90,(char *)CONCAT44(iVar6,iVar9));
      LegacyFullClassName<google::protobuf::Descriptor>(message_00,(bool)is_descriptor_00);
      io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
                (in_stack_fffffffffffffdb0,(char *)CONCAT44(iVar4,iVar7),
                 &in_stack_fffffffffffffda0->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar5,iVar10),&in_stack_fffffffffffffd90->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar6,iVar9));
      std::__cxx11::string::~string(local_220);
      LegacyGenerateClassFile<google::protobuf::Descriptor>
                ((FileDescriptor *)CONCAT44(iVar3,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8,(bool)in_stack_fffffffffffffed7,in_stack_fffffffffffffec8
                );
    }
    for (local_224 = 0; iVar3 = Descriptor::nested_type_count(in_RSI), local_224 < iVar3;
        local_224 = local_224 + 1) {
      in_stack_fffffffffffffd50 = in_RDI;
      Descriptor::nested_type(in_RSI,local_224);
      GenerateMessageFile((FileDescriptor *)in_RSI,
                          (Descriptor *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                          SUB81((ulong)in_RCX >> 0x38,0),
                          (GeneratorContext *)in_stack_ffffffffffffffd8);
    }
    local_228 = 0;
    while (iVar3 = local_228, iVar7 = Descriptor::enum_type_count(in_RSI), iVar3 < iVar7) {
      in_stack_fffffffffffffd40 = (Printer *)Descriptor::enum_type(in_RSI,local_228);
      GenerateEnumFile((FileDescriptor *)
                       CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7,
                       in_stack_ffffffffffffffb8);
      local_228 = local_228 + 1;
    }
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_118);
    io::Printer::~Printer(in_stack_fffffffffffffd40);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   *)in_stack_fffffffffffffd50);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void GenerateMessageFile(const FileDescriptor* file, const Descriptor* message,
                         bool is_descriptor,
                         GeneratorContext* generator_context) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }

  std::string filename = GeneratedClassFileName(message, is_descriptor);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateUseDeclaration(is_descriptor, &printer);

  GenerateMessageDocComment(&printer, message, is_descriptor);
  if (lastindex != string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  printer.Print(
      "class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n"
      "{\n",
      "name", fullname);
  Indent(&printer);

  // Field and oneof definitions.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateField(field, &printer, is_descriptor);
  }
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    GenerateOneofField(oneof, &printer);
  }
  printer.Print("\n");

  GenerateMessageConstructorDocComment(&printer, message, is_descriptor);
  printer.Print(
      "public function __construct($data = NULL) {\n");
  Indent(&printer);

  std::string metadata_filename =
      GeneratedMetadataFileName(file, is_descriptor);
  std::string metadata_fullname = FilenameToClassname(metadata_filename);
  printer.Print(
      "\\^fullname^::initOnce();\n"
      "parent::__construct($data);\n",
      "fullname", metadata_fullname);

  Outdent(&printer);
  printer.Print("}\n\n");

  // Field and oneof accessors.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateFieldAccessor(field, is_descriptor, &printer);
  }
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer.Print(
      "/**\n"
      " * @return string\n"
      " */\n"
      "public function get^camel_name^()\n"
      "{\n"
      "    return $this->whichOneof(\"^name^\");\n"
      "}\n\n",
      "camel_name", UnderscoresToCamelCase(oneof->name(), true), "name",
      oneof->name());
  }

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatiblity with nested messages and enums
  if (message->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(message, is_descriptor));
    LegacyGenerateClassFile(file, message, is_descriptor, generator_context);
  }

  // Nested messages and enums.
  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageFile(file, message->nested_type(i), is_descriptor,
                        generator_context);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumFile(file, message->enum_type(i), is_descriptor,
                     generator_context);
  }
}